

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiply_test.cc
# Opt level: O1

void intgemm::TestMultiplyBiasRelu<intgemm::SSE2::Kernels16>
               (Index A_rows,Index width,Index B_cols,float int_tolerance,float float_tolerance,
               float MSE_float_tolerance,float MSE_int_tolerance)

{
  float *pfVar1;
  float *pfVar2;
  int16_t iVar3;
  int16_t iVar4;
  int16_t iVar5;
  int16_t iVar6;
  int16_t iVar7;
  int16_t iVar8;
  int16_t iVar9;
  int16_t iVar10;
  int16_t iVar11;
  int16_t iVar12;
  int16_t iVar13;
  int16_t iVar14;
  int16_t iVar15;
  int16_t iVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  UnquantizeAndAddBiasAndWriteRelu callback;
  anon_class_16_2_a84000ed callback_00;
  float *int_ref;
  size_t __i;
  ostream *poVar23;
  long lVar24;
  ulong uVar25;
  short *psVar26;
  int iVar27;
  ulong uVar28;
  Index r;
  ulong uVar29;
  long lVar30;
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  __m128i tmp;
  __m128i tmp_1;
  float unquant_mult;
  AlignedVector<float> B;
  AlignedVector<float> test_C;
  AlignedVector<float> A;
  AlignedVector<float> bias;
  AlignedVector<short> A_prep;
  AlignedVector<float> float_C;
  AlignedVector<float> slowint_C;
  AlignedVector<short> B_quant;
  AlignedVector<short> B_prep;
  ostringstream info;
  mt19937 gen;
  AlignedVector<float> *pAVar40;
  undefined4 local_162c;
  AlignedVector<float> local_1628;
  AlignedVector<float> local_1618;
  AlignedVector<float> local_1608;
  float local_15f8;
  float local_15f4;
  float local_15f0;
  float local_15ec;
  AlignedVector<float> local_15e8;
  ulong local_15d8;
  AlignedVector<short> local_15d0;
  AlignedVector<float> local_15c0;
  AlignedVector<float> local_15b0;
  AlignedVector<short> local_15a0;
  AlignedVector<short> local_1590;
  ulong local_1580;
  undefined4 local_1578;
  undefined4 uStack_1574;
  float *pfStack_1570;
  AlignedVector<float> *local_1568;
  undefined4 *local_1560;
  AlignedVector<float> *pAStack_1558;
  string local_1550;
  ostringstream local_1530 [112];
  ios_base local_14c0 [264];
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  local_15f8 = int_tolerance;
  local_15f4 = float_tolerance;
  local_15f0 = MSE_float_tolerance;
  local_15ec = MSE_int_tolerance;
  std::__cxx11::ostringstream::ostringstream(local_1530);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1530,"16-bit SSE2",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1530,"\t",1);
  poVar23 = std::ostream::_M_insert<unsigned_long>((ulong)local_1530);
  local_13b8._M_x[0]._0_1_ = 9;
  poVar23 = std::__ostream_insert<char,std::char_traits<char>>(poVar23,(char *)&local_13b8,1);
  poVar23 = std::ostream::_M_insert<unsigned_long>((ulong)poVar23);
  local_13b8._M_x[0]._0_1_ = 9;
  poVar23 = std::__ostream_insert<char,std::char_traits<char>>(poVar23,(char *)&local_13b8,1);
  local_15d8 = (ulong)B_cols;
  poVar23 = std::ostream::_M_insert<unsigned_long>((ulong)poVar23);
  local_13b8._M_x[0] = CONCAT71(local_13b8._M_x[0]._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar23,(char *)&local_13b8,1);
  local_1580 = (ulong)(width * A_rows);
  AlignedVector<float>::AlignedVector(&local_1608,local_1580,0x40);
  AlignedVector<float>::AlignedVector(&local_1628,(ulong)(B_cols * width),0x40);
  AlignedVector<float>::AlignedVector(&local_15e8,local_15d8,0x40);
  pfVar1 = local_1608.mem_;
  local_13b8._M_x[0] = 0x1571;
  lVar24 = 1;
  uVar25 = 0x1571;
  do {
    uVar25 = (ulong)(((uint)(uVar25 >> 0x1e) ^ (uint)uVar25) * 0x6c078965 + (int)lVar24);
    local_13b8._M_x[lVar24] = uVar25;
    lVar24 = lVar24 + 1;
  } while (lVar24 != 0x270);
  local_13b8._M_p = 0x270;
  if (local_1608.size_ != 0) {
    lVar30 = local_1608.size_ << 2;
    lVar24 = 0;
    do {
      fVar31 = std::
               generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                         (&local_13b8);
      *(float *)((long)pfVar1 + lVar24) = fVar31 + fVar31 + -1.0;
      lVar24 = lVar24 + 4;
    } while (lVar30 != lVar24);
  }
  pfVar1 = local_1628.mem_;
  lVar24 = CONCAT44(local_1628.size_._4_4_,(uint)local_1628.size_);
  if (lVar24 != 0) {
    lVar30 = 0;
    do {
      fVar31 = std::
               generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                         (&local_13b8);
      *(float *)((long)pfVar1 + lVar30) = fVar31 + fVar31 + -1.0;
      lVar30 = lVar30 + 4;
    } while (lVar24 << 2 != lVar30);
  }
  pfVar1 = local_15e8.mem_;
  if (local_15e8.size_ != 0) {
    lVar24 = 0;
    do {
      fVar31 = std::
               generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                         (&local_13b8);
      *(float *)((long)pfVar1 + lVar24) = fVar31 + fVar31 + -1.0;
      lVar24 = lVar24 + 4;
    } while (local_15e8.size_ << 2 != lVar24);
  }
  local_162c = 0x35800000;
  AlignedVector<short>::AlignedVector(&local_15d0,local_1608.size_,0x40);
  AlignedVector<short>::AlignedVector
            (&local_1590,CONCAT44(local_1628.size_._4_4_,(uint)local_1628.size_),0x40);
  if (local_1580 != 0) {
    lVar24 = 0;
    do {
      pfVar1 = (float *)((long)local_1608.mem_ + lVar24 * 2);
      auVar32._0_4_ = (int)(*pfVar1 * 1024.0);
      auVar32._4_4_ = (int)(pfVar1[1] * 1024.0);
      auVar32._8_4_ = (int)(pfVar1[2] * 1024.0);
      auVar32._12_4_ = (int)(pfVar1[3] * 1024.0);
      auVar36._0_4_ = (int)(pfVar1[4] * 1024.0);
      auVar36._4_4_ = (int)(pfVar1[5] * 1024.0);
      auVar36._8_4_ = (int)(pfVar1[6] * 1024.0);
      auVar36._12_4_ = (int)(pfVar1[7] * 1024.0);
      auVar32 = packssdw(auVar32,auVar36);
      *(undefined1 (*) [16])((long)local_15d0.mem_ + lVar24) = auVar32;
      lVar24 = lVar24 + 0x10;
    } while (pfVar1 + 8 != local_1608.mem_ + local_1580);
  }
  if (B_cols != 0) {
    uVar25 = 0;
    psVar26 = local_1590.mem_;
    do {
      if (width != 0) {
        uVar28 = 0;
        uVar29 = 0;
        do {
          iVar27 = (int)uVar28;
          lVar24 = 0;
          do {
            pfVar1 = local_1628.mem_ + uVar25 + uVar28;
            pfVar2 = local_1628.mem_ + uVar25 + uVar28 + 4;
            auVar33._0_4_ = (int)(*pfVar1 * 1024.0);
            auVar33._4_4_ = (int)(pfVar1[1] * 1024.0);
            auVar33._8_4_ = (int)(pfVar1[2] * 1024.0);
            auVar33._12_4_ = (int)(pfVar1[3] * 1024.0);
            auVar37._0_4_ = (int)(*pfVar2 * 1024.0);
            auVar37._4_4_ = (int)(pfVar2[1] * 1024.0);
            auVar37._8_4_ = (int)(pfVar2[2] * 1024.0);
            auVar37._12_4_ = (int)(pfVar2[3] * 1024.0);
            auVar32 = packssdw(auVar33,auVar37);
            *(undefined1 (*) [16])((long)psVar26 + lVar24) = auVar32;
            lVar24 = lVar24 + 0x10;
            uVar28 = (ulong)((int)uVar28 + B_cols);
          } while (lVar24 != 0x80);
          iVar3 = psVar26[1];
          iVar4 = psVar26[2];
          iVar5 = psVar26[3];
          iVar6 = psVar26[8];
          iVar7 = psVar26[9];
          iVar8 = psVar26[10];
          iVar9 = psVar26[0xb];
          iVar10 = psVar26[0x11];
          iVar11 = psVar26[0x12];
          iVar12 = psVar26[0x13];
          iVar13 = psVar26[0x18];
          iVar14 = psVar26[0x19];
          iVar15 = psVar26[0x1a];
          iVar16 = psVar26[0x1b];
          psVar26[8] = psVar26[4];
          psVar26[9] = psVar26[0xc];
          psVar26[10] = psVar26[5];
          psVar26[0xb] = psVar26[0xd];
          psVar26[0xc] = psVar26[6];
          psVar26[0xd] = psVar26[0xe];
          psVar26[0xe] = psVar26[7];
          psVar26[0xf] = psVar26[0xf];
          *psVar26 = *psVar26;
          psVar26[1] = iVar6;
          psVar26[2] = iVar3;
          psVar26[3] = iVar7;
          psVar26[4] = iVar4;
          psVar26[5] = iVar8;
          psVar26[6] = iVar5;
          psVar26[7] = iVar9;
          psVar26[0x18] = psVar26[0x14];
          psVar26[0x19] = psVar26[0x1c];
          psVar26[0x1a] = psVar26[0x15];
          psVar26[0x1b] = psVar26[0x1d];
          psVar26[0x1c] = psVar26[0x16];
          psVar26[0x1d] = psVar26[0x1e];
          psVar26[0x1e] = psVar26[0x17];
          psVar26[0x1f] = psVar26[0x1f];
          psVar26[0x10] = psVar26[0x10];
          psVar26[0x11] = iVar13;
          psVar26[0x12] = iVar10;
          psVar26[0x13] = iVar14;
          psVar26[0x14] = iVar11;
          psVar26[0x15] = iVar15;
          psVar26[0x16] = iVar12;
          psVar26[0x17] = iVar16;
          iVar3 = psVar26[0x21];
          iVar4 = psVar26[0x22];
          iVar5 = psVar26[0x23];
          iVar6 = psVar26[0x28];
          iVar7 = psVar26[0x29];
          iVar8 = psVar26[0x2a];
          iVar9 = psVar26[0x2b];
          psVar26[0x28] = psVar26[0x24];
          psVar26[0x29] = psVar26[0x2c];
          psVar26[0x2a] = psVar26[0x25];
          psVar26[0x2b] = psVar26[0x2d];
          psVar26[0x2c] = psVar26[0x26];
          psVar26[0x2d] = psVar26[0x2e];
          psVar26[0x2e] = psVar26[0x27];
          psVar26[0x2f] = psVar26[0x2f];
          psVar26[0x20] = psVar26[0x20];
          psVar26[0x21] = iVar6;
          psVar26[0x22] = iVar3;
          psVar26[0x23] = iVar7;
          psVar26[0x24] = iVar4;
          psVar26[0x25] = iVar8;
          psVar26[0x26] = iVar5;
          psVar26[0x27] = iVar9;
          iVar3 = psVar26[0x31];
          iVar4 = psVar26[0x32];
          iVar5 = psVar26[0x33];
          iVar6 = psVar26[0x38];
          iVar7 = psVar26[0x39];
          iVar8 = psVar26[0x3a];
          iVar9 = psVar26[0x3b];
          psVar26[0x38] = psVar26[0x34];
          psVar26[0x39] = psVar26[0x3c];
          psVar26[0x3a] = psVar26[0x35];
          psVar26[0x3b] = psVar26[0x3d];
          psVar26[0x3c] = psVar26[0x36];
          psVar26[0x3d] = psVar26[0x3e];
          psVar26[0x3e] = psVar26[0x37];
          psVar26[0x3f] = psVar26[0x3f];
          psVar26[0x30] = psVar26[0x30];
          psVar26[0x31] = iVar6;
          psVar26[0x32] = iVar3;
          psVar26[0x33] = iVar7;
          psVar26[0x34] = iVar4;
          psVar26[0x35] = iVar8;
          psVar26[0x36] = iVar5;
          psVar26[0x37] = iVar9;
          uVar17 = *(undefined4 *)(psVar26 + 2);
          uVar18 = *(undefined4 *)(psVar26 + 0x10);
          uVar19 = *(undefined4 *)(psVar26 + 0x12);
          *(undefined4 *)(psVar26 + 0x10) = *(undefined4 *)(psVar26 + 4);
          *(undefined4 *)(psVar26 + 0x12) = *(undefined4 *)(psVar26 + 0x14);
          *(undefined4 *)(psVar26 + 0x14) = *(undefined4 *)(psVar26 + 6);
          *(undefined4 *)(psVar26 + 0x16) = *(undefined4 *)(psVar26 + 0x16);
          *(undefined4 *)psVar26 = *(undefined4 *)psVar26;
          *(undefined4 *)(psVar26 + 2) = uVar18;
          *(undefined4 *)(psVar26 + 4) = uVar17;
          *(undefined4 *)(psVar26 + 6) = uVar19;
          uVar17 = *(undefined4 *)(psVar26 + 10);
          uVar18 = *(undefined4 *)(psVar26 + 0x18);
          uVar19 = *(undefined4 *)(psVar26 + 0x1a);
          *(undefined4 *)(psVar26 + 0x18) = *(undefined4 *)(psVar26 + 0xc);
          *(undefined4 *)(psVar26 + 0x1a) = *(undefined4 *)(psVar26 + 0x1c);
          *(undefined4 *)(psVar26 + 0x1c) = *(undefined4 *)(psVar26 + 0xe);
          *(undefined4 *)(psVar26 + 0x1e) = *(undefined4 *)(psVar26 + 0x1e);
          *(undefined4 *)(psVar26 + 8) = *(undefined4 *)(psVar26 + 8);
          *(undefined4 *)(psVar26 + 10) = uVar18;
          *(undefined4 *)(psVar26 + 0xc) = uVar17;
          *(undefined4 *)(psVar26 + 0xe) = uVar19;
          uVar17 = *(undefined4 *)(psVar26 + 0x22);
          uVar18 = *(undefined4 *)(psVar26 + 0x30);
          uVar19 = *(undefined4 *)(psVar26 + 0x32);
          *(undefined4 *)(psVar26 + 0x30) = *(undefined4 *)(psVar26 + 0x24);
          *(undefined4 *)(psVar26 + 0x32) = *(undefined4 *)(psVar26 + 0x34);
          *(undefined4 *)(psVar26 + 0x34) = *(undefined4 *)(psVar26 + 0x26);
          *(undefined4 *)(psVar26 + 0x36) = *(undefined4 *)(psVar26 + 0x36);
          *(undefined4 *)(psVar26 + 0x20) = *(undefined4 *)(psVar26 + 0x20);
          *(undefined4 *)(psVar26 + 0x22) = uVar18;
          *(undefined4 *)(psVar26 + 0x24) = uVar17;
          *(undefined4 *)(psVar26 + 0x26) = uVar19;
          uVar17 = *(undefined4 *)(psVar26 + 0x2a);
          uVar18 = *(undefined4 *)(psVar26 + 0x38);
          uVar19 = *(undefined4 *)(psVar26 + 0x3a);
          *(undefined4 *)(psVar26 + 0x38) = *(undefined4 *)(psVar26 + 0x2c);
          *(undefined4 *)(psVar26 + 0x3a) = *(undefined4 *)(psVar26 + 0x3c);
          *(undefined4 *)(psVar26 + 0x3c) = *(undefined4 *)(psVar26 + 0x2e);
          *(undefined4 *)(psVar26 + 0x3e) = *(undefined4 *)(psVar26 + 0x3e);
          *(undefined4 *)(psVar26 + 0x28) = *(undefined4 *)(psVar26 + 0x28);
          *(undefined4 *)(psVar26 + 0x2a) = uVar18;
          *(undefined4 *)(psVar26 + 0x2c) = uVar17;
          *(undefined4 *)(psVar26 + 0x2e) = uVar19;
          uVar20 = *(undefined8 *)(psVar26 + 0x20);
          auVar34._8_8_ = *(undefined8 *)(psVar26 + 0x24);
          auVar34._0_8_ = *(undefined8 *)(psVar26 + 4);
          *(undefined1 (*) [16])(psVar26 + 0x20) = auVar34;
          *(undefined8 *)psVar26 = *(undefined8 *)psVar26;
          *(undefined8 *)(psVar26 + 4) = uVar20;
          uVar20 = *(undefined8 *)(psVar26 + 8);
          uVar21 = *(undefined8 *)(psVar26 + 0x28);
          *(undefined8 *)(psVar26 + 0x28) = *(undefined8 *)(psVar26 + 0xc);
          *(undefined8 *)(psVar26 + 0x2c) = *(undefined8 *)(psVar26 + 0x2c);
          *(undefined8 *)(psVar26 + 8) = uVar20;
          *(undefined8 *)(psVar26 + 0xc) = uVar21;
          uVar22 = *(undefined8 *)(psVar26 + 0x30);
          auVar38._8_8_ = *(undefined8 *)(psVar26 + 0x34);
          auVar38._0_8_ = *(undefined8 *)(psVar26 + 0x14);
          *(undefined1 (*) [16])(psVar26 + 0x30) = auVar38;
          *(undefined8 *)(psVar26 + 0x10) = *(undefined8 *)(psVar26 + 0x10);
          *(undefined8 *)(psVar26 + 0x14) = uVar22;
          uVar19 = *(undefined4 *)(psVar26 + 0x18);
          uVar17 = *(undefined4 *)(psVar26 + 0x38);
          uVar18 = *(undefined4 *)(psVar26 + 0x3a);
          *(undefined4 *)(psVar26 + 0x38) = *(undefined4 *)(psVar26 + 0x1c);
          *(undefined4 *)(psVar26 + 0x3a) = *(undefined4 *)(psVar26 + 0x1e);
          *(undefined4 *)(psVar26 + 0x3c) = *(undefined4 *)(psVar26 + 0x3c);
          *(undefined4 *)(psVar26 + 0x3e) = *(undefined4 *)(psVar26 + 0x3e);
          *(undefined1 (*) [16])(psVar26 + 8) = auVar34;
          *(undefined8 *)(psVar26 + 0x20) = uVar20;
          *(undefined8 *)(psVar26 + 0x24) = uVar21;
          *(undefined1 (*) [16])(psVar26 + 0x18) = auVar38;
          *(undefined4 *)(psVar26 + 0x30) = uVar19;
          *(undefined4 *)(psVar26 + 0x32) = *(undefined4 *)(psVar26 + 0x1a);
          *(undefined4 *)(psVar26 + 0x34) = uVar17;
          *(undefined4 *)(psVar26 + 0x36) = uVar18;
          uVar29 = uVar29 + 8;
          psVar26 = psVar26 + 0x40;
          uVar28 = (ulong)(iVar27 + B_cols * 8);
        } while (uVar29 < width);
      }
      uVar25 = uVar25 + 8;
    } while (uVar25 < local_15d8);
  }
  AlignedVector<float>::AlignedVector(&local_1618,(ulong)(B_cols * A_rows),0x40);
  local_1578 = local_162c;
  pfStack_1570 = local_15e8.mem_;
  local_1568 = (AlignedVector<float> *)local_1618.mem_;
  callback._4_4_ = uStack_1574;
  callback.unquant_mult = (float)local_162c;
  callback.bias_addr = local_15e8.mem_;
  callback.output_addr = local_1618.mem_;
  pAVar40 = (AlignedVector<float> *)local_1618.mem_;
  SSE2::Kernels16::Multiply<intgemm::callbacks::UnquantizeAndAddBiasAndWriteRelu>
            (local_15d0.mem_,local_1590.mem_,A_rows,width,B_cols,callback);
  AlignedVector<short>::AlignedVector
            (&local_15a0,CONCAT44(local_1628.size_._4_4_,(uint)local_1628.size_),0x40);
  if ((ulong)(uint)local_1628.size_ != 0) {
    lVar24 = 0;
    do {
      pfVar1 = (float *)((long)local_1628.mem_ + lVar24 * 2);
      auVar35._0_4_ = (int)(*pfVar1 * 1024.0);
      auVar35._4_4_ = (int)(pfVar1[1] * 1024.0);
      auVar35._8_4_ = (int)(pfVar1[2] * 1024.0);
      auVar35._12_4_ = (int)(pfVar1[3] * 1024.0);
      auVar39._0_4_ = (int)(pfVar1[4] * 1024.0);
      auVar39._4_4_ = (int)(pfVar1[5] * 1024.0);
      auVar39._8_4_ = (int)(pfVar1[6] * 1024.0);
      auVar39._12_4_ = (int)(pfVar1[7] * 1024.0);
      auVar32 = packssdw(auVar35,auVar39);
      *(undefined1 (*) [16])((long)local_15a0.mem_ + lVar24) = auVar32;
      lVar24 = lVar24 + 0x10;
    } while (pfVar1 + 8 != local_1628.mem_ + (uint)local_1628.size_);
  }
  AlignedVector<float>::AlignedVector(&local_15b0,local_1618.size_,0x40);
  local_1560 = &local_162c;
  callback_00.bias = pAVar40;
  callback_00.unquant_mult = (float *)&local_15e8;
  pAStack_1558 = &local_15e8;
  references::
  Multiply<short,_short,_float,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kpu[P]intgemm_test_multiply_test_cc:460:99),_nullptr>
            ((references *)local_15d0.mem_,local_15a0.mem_,(short *)local_15b0.mem_,
             (float *)(ulong)A_rows,width,B_cols,(Index)local_1560,callback_00);
  AlignedVector<float>::AlignedVector(&local_15c0,local_1618.size_,0x40);
  references::
  Multiply<float,_float,_float,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kpu[P]intgemm_test_multiply_test_cc:465:86),_nullptr>
            (local_1608.mem_,local_1628.mem_,local_15c0.mem_,A_rows,width,B_cols,&local_15e8);
  int_ref = local_15b0.mem_;
  pfVar2 = local_15c0.mem_;
  pfVar1 = local_1618.mem_;
  std::__cxx11::stringbuf::str();
  CompareMSE(pfVar2,int_ref,pfVar1,local_1618.size_,&local_1550,local_15f8,local_15f4,local_15f0,
             local_15ec);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1550._M_dataplus._M_p != &local_1550.field_2) {
    operator_delete(local_1550._M_dataplus._M_p);
  }
  free(local_15c0.mem_);
  free(local_15b0.mem_);
  free(local_15a0.mem_);
  free(local_1618.mem_);
  free(local_1590.mem_);
  free(local_15d0.mem_);
  free(local_15e8.mem_);
  free(local_1628.mem_);
  free(local_1608.mem_);
  std::__cxx11::ostringstream::~ostringstream(local_1530);
  std::ios_base::~ios_base(local_14c0);
  return;
}

Assistant:

void TestMultiplyBiasRelu(Index A_rows, Index width, Index B_cols,
 float int_tolerance = 0.1f, float float_tolerance = 1.0f, float MSE_float_tolerance = 0.0f, float MSE_int_tolerance = 0.0f) {
  using Integer = typename Routine::Integer;
  std::ostringstream info;
  info << Routine::kName << "\t" << A_rows << '\t' << width << '\t' << B_cols << '\n';

  // Initialize A and B.
  AlignedVector<float> A(A_rows * width);
  AlignedVector<float> B(width * B_cols);
  AlignedVector<float> bias(B_cols);
  std::mt19937 gen;
  std::uniform_real_distribution<float> dist(-1.0f, 1.0f);
  for (auto& it : A) {
    it = dist(gen);
  }
  for (auto& it : B) {
    it = dist(gen);
  }
  for (auto& it : bias) {
    it = dist(gen);
  }

  float quant_mult = (sizeof(Integer) == 2) ? 1024 : 64;
  float unquant_mult = 1.0f / (quant_mult*quant_mult);

  AlignedVector<Integer> A_prep(A.size());
  AlignedVector<Integer> B_prep(B.size());
  Routine::PrepareA(A.begin(), A_prep.begin(), quant_mult, A_rows, width);
  Routine::PrepareB(B.begin(), B_prep.begin(), quant_mult, width, B_cols);

  AlignedVector<float> test_C(A_rows * B_cols);

  Routine::Multiply(A_prep.begin(), B_prep.begin(), A_rows, width, B_cols, callbacks::UnquantizeAndAddBiasAndWriteRelu(unquant_mult, bias.begin(), test_C.begin()));

  AlignedVector<Integer> B_quant(B.size());
  Routine::Quantize(B.begin(), B_quant.begin(), quant_mult, static_cast<Index>(B.size()));
  AlignedVector<float> slowint_C(test_C.size());
  // Assuming A is just quantization here.
  references::Multiply(A_prep.begin(), B_quant.begin(), slowint_C.begin(), A_rows, width, B_cols, [&](int32_t sum, const callbacks::OutputBufferInfo& info) {
    return std::max(0.0f, sum * unquant_mult + bias[info.col_idx]);
  });

  AlignedVector<float> float_C(test_C.size());
  references::Multiply(A.begin(), B.begin(), float_C.begin(), A_rows, width, B_cols, [&](double sum, const callbacks::OutputBufferInfo& info) {
    return std::max(0.0f, static_cast<float>(sum) + bias[info.col_idx]);
  });

  CompareMSE(float_C.begin(), slowint_C.begin(), test_C.begin(), test_C.size(), info.str(),
   int_tolerance, float_tolerance, MSE_float_tolerance, MSE_int_tolerance);
}